

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_hotspot.cxx
# Opt level: O0

void __thiscall Fl_Window::hotspot(Fl_Window *this,Fl_Widget *o,int offscreen)

{
  int iVar1;
  int local_24;
  int local_20;
  int Y;
  int X;
  int offscreen_local;
  Fl_Widget *o_local;
  Fl_Window *this_local;
  
  local_20 = Fl_Widget::w(o);
  local_20 = local_20 / 2;
  local_24 = Fl_Widget::h(o);
  local_24 = local_24 / 2;
  for (_X = (Fl_Window *)o; _X != this && _X != (Fl_Window *)0x0;
      _X = Fl_Widget::window((Fl_Widget *)_X)) {
    iVar1 = Fl_Widget::x((Fl_Widget *)_X);
    local_20 = iVar1 + local_20;
    iVar1 = Fl_Widget::y((Fl_Widget *)_X);
    local_24 = iVar1 + local_24;
  }
  hotspot(this,local_20,local_24,offscreen);
  return;
}

Assistant:

void Fl_Window::hotspot(const Fl_Widget *o, int offscreen) {
  int X = o->w()/2;
  int Y = o->h()/2;
  while (o != this && o) {
    X += o->x(); Y += o->y();
    o = o->window();
  }
  hotspot(X,Y,offscreen);
}